

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale.cpp
# Opt level: O0

int __thiscall
ncnn::Scale::forward_inplace
          (Scale *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_top_blobs,Option *opt)

{
  float fVar1;
  float fVar2;
  float *pfVar3;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  int i_5;
  float s_3;
  float *ptr_4;
  int q_1;
  int i_4;
  float bias_1;
  float s_2;
  float *ptr_3;
  int q;
  int size;
  int channels;
  int h_1;
  int w_2;
  int j_1;
  float s_1;
  float *ptr_2;
  int i_3;
  int j;
  float bias;
  float s;
  float *ptr_1;
  int i_2;
  int h;
  int w_1;
  int i_1;
  int i;
  float *ptr;
  int w;
  int dims;
  Mat *scale_blob;
  Mat *bottom_top_blob;
  int in_stack_fffffffffffffea8;
  float in_stack_fffffffffffffeac;
  Mat local_150;
  float *local_108;
  int local_fc;
  int local_f8;
  float local_f4;
  float local_f0;
  Mat local_e0;
  float *local_98;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  float local_74;
  float *local_70;
  int local_68;
  int local_64;
  float local_60;
  float local_5c;
  float *local_58;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  float *local_38;
  int local_30;
  int local_2c;
  reference local_28;
  Mat *local_20;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_10;
  
  local_10 = in_RSI;
  local_20 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_28 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_10,1);
  local_2c = local_20->dims;
  if (local_2c == 1) {
    local_30 = local_20->w;
    local_38 = ncnn::Mat::operator_cast_to_float_(local_20);
    if (*(int *)(in_RDI + 0xd4) == 0) {
      for (local_40 = 0; local_40 < local_30; local_40 = local_40 + 1) {
        pfVar3 = ncnn::Mat::operator[](local_28,(long)local_40);
        local_38[local_40] = *pfVar3 * local_38[local_40];
      }
    }
    else {
      for (local_3c = 0; local_3c < local_30; local_3c = local_3c + 1) {
        fVar1 = local_38[local_3c];
        pfVar3 = ncnn::Mat::operator[](local_28,(long)local_3c);
        fVar2 = *pfVar3;
        pfVar3 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0x120),(long)local_3c);
        local_38[local_3c] = fVar1 * fVar2 + *pfVar3;
      }
    }
  }
  if (local_2c == 2) {
    local_44 = local_20->w;
    local_48 = local_20->h;
    if (*(int *)(in_RDI + 0xd4) == 0) {
      for (local_68 = 0; local_68 < local_48; local_68 = local_68 + 1) {
        local_70 = ncnn::Mat::row(local_20,local_68);
        pfVar3 = ncnn::Mat::operator[](local_28,(long)local_68);
        local_74 = *pfVar3;
        for (local_78 = 0; local_78 < local_44; local_78 = local_78 + 1) {
          local_70[local_78] = local_74 * local_70[local_78];
        }
      }
    }
    else {
      for (local_4c = 0; local_4c < local_48; local_4c = local_4c + 1) {
        local_58 = ncnn::Mat::row(local_20,local_4c);
        pfVar3 = ncnn::Mat::operator[](local_28,(long)local_4c);
        local_5c = *pfVar3;
        pfVar3 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0x120),(long)local_4c);
        local_60 = *pfVar3;
        for (local_64 = 0; local_64 < local_44; local_64 = local_64 + 1) {
          local_58[local_64] = local_58[local_64] * local_5c + local_60;
        }
      }
    }
  }
  if (local_2c == 3) {
    local_7c = local_20->w;
    local_80 = local_20->h;
    local_84 = local_20->c;
    local_88 = local_7c * local_80;
    if (*(int *)(in_RDI + 0xd4) == 0) {
      for (local_fc = 0; local_fc < local_84; local_fc = local_fc + 1) {
        ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                           (int)((ulong)in_RDI >> 0x20));
        pfVar3 = ncnn::Mat::operator_cast_to_float_(&local_150);
        ncnn::Mat::~Mat((Mat *)0x4fd1b9);
        local_108 = pfVar3;
        pfVar3 = ncnn::Mat::operator[](local_28,(long)local_fc);
        in_stack_fffffffffffffeac = *pfVar3;
        for (in_stack_fffffffffffffea8 = 0; in_stack_fffffffffffffea8 < local_88;
            in_stack_fffffffffffffea8 = in_stack_fffffffffffffea8 + 1) {
          local_108[in_stack_fffffffffffffea8] =
               in_stack_fffffffffffffeac * local_108[in_stack_fffffffffffffea8];
        }
      }
    }
    else {
      for (local_8c = 0; local_8c < local_84; local_8c = local_8c + 1) {
        ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                           (int)((ulong)in_RDI >> 0x20));
        pfVar3 = ncnn::Mat::operator_cast_to_float_(&local_e0);
        ncnn::Mat::~Mat((Mat *)0x4fd061);
        local_98 = pfVar3;
        pfVar3 = ncnn::Mat::operator[](local_28,(long)local_8c);
        local_f0 = *pfVar3;
        pfVar3 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0x120),(long)local_8c);
        local_f4 = *pfVar3;
        for (local_f8 = 0; local_f8 < local_88; local_f8 = local_f8 + 1) {
          local_98[local_f8] = local_98[local_f8] * local_f0 + local_f4;
        }
      }
    }
  }
  return 0;
}

Assistant:

int Scale::forward_inplace(std::vector<Mat>& bottom_top_blobs, const Option& opt) const
{
    Mat& bottom_top_blob = bottom_top_blobs[0];
    const Mat& scale_blob = bottom_top_blobs[1];

    int dims = bottom_top_blob.dims;

    if (dims == 1)
    {
        int w = bottom_top_blob.w;

        float* ptr = bottom_top_blob;

        if (bias_term)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                ptr[i] = ptr[i] * scale_blob[i] + bias_data[i];
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                ptr[i] *= scale_blob[i];
            }
        }
    }

    if (dims == 2)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;

        if (bias_term)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);
                float s = scale_blob[i];
                float bias = bias_data[i];

                for (int j = 0; j < w; j++)
                {
                    ptr[j] = ptr[j] * s + bias;
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);
                float s = scale_blob[i];

                for (int j = 0; j < w; j++)
                {
                    ptr[j] *= s;
                }
            }
        }
    }

    if (dims == 3)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        if (bias_term)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                float s = scale_blob[q];
                float bias = bias_data[q];

                for (int i = 0; i < size; i++)
                {
                    ptr[i] = ptr[i] * s + bias;
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                float s = scale_blob[q];

                for (int i = 0; i < size; i++)
                {
                    ptr[i] *= s;
                }
            }
        }
    }

    return 0;
}